

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# costas.cc
# Opt level: O1

void __thiscall Costas::work(Costas *this,size_t nsamples,complex<float> *fi,complex<float> *fo)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t j_2;
  size_t j;
  long lVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  _ComplexT _Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  complex<float> sincos [4];
  float local_68 [14];
  
  if (nsamples != 0) {
    uVar4 = 0;
    do {
      uVar1 = this->phase_;
      uVar2 = this->freq_;
      local_68[8] = -((float)uVar2 * 0.0 + (float)uVar1);
      local_68[9] = -((float)uVar1 + (float)uVar2);
      local_68[10] = -((float)uVar2 * 2.0 + (float)uVar1);
      local_68[0xb] = -((float)uVar2 * 3.0 + (float)uVar1);
      local_68[4] = 0.0;
      local_68[5] = 0.0;
      local_68[6] = 0.0;
      local_68[7] = 0.0;
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_68[2] = 0.0;
      local_68[3] = 0.0;
      lVar3 = 0;
      do {
        fVar6 = local_68[lVar3 + 8];
        fVar5 = cosf(fVar6);
        local_68[lVar3 * 2] = fVar5;
        fVar6 = sinf(fVar6);
        local_68[lVar3 * 2 + 1] = fVar6;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      lVar3 = 0;
      do {
        fVar8 = (float)*(undefined8 *)(local_68 + lVar3 * 2);
        fVar9 = (float)((ulong)*(undefined8 *)(local_68 + lVar3 * 2) >> 0x20);
        fVar10 = (float)fi[lVar3]._M_value;
        fVar11 = (float)(fi[lVar3]._M_value >> 0x20);
        fVar6 = fVar8 * fVar10 - fVar9 * fVar11;
        fVar5 = fVar10 * fVar9 + fVar11 * fVar8;
        _Var7 = CONCAT44(fVar5,fVar6);
        if ((NAN(fVar6)) && (_Var7 = CONCAT44(fVar5,fVar6), NAN(fVar5))) {
          _Var7 = __mulsc3(fVar10,fVar11,fVar8,CONCAT44(fVar9,fVar9));
        }
        fo[lVar3]._M_value = _Var7;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      fVar6 = 0.0;
      lVar3 = 0;
      do {
        fVar5 = *(float *)&fo[lVar3]._M_value * *(float *)((long)&fo[lVar3]._M_value + 4);
        fVar6 = fVar6 + (ABS(fVar5 + 1.0) - ABS(fVar5 + -1.0)) * 0.5 * 0.25;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      fVar5 = this->beta_ * fVar6 + this->freq_;
      fVar6 = fVar6 * this->alpha_ + fVar5 + this->phase_;
      this->phase_ = fVar6;
      this->freq_ = (ABS(fVar5 + this->maxDeviation_) - ABS(fVar5 - this->maxDeviation_)) * 0.5;
      if (6.2831855 <= ABS(fVar6) && ABS(fVar6) != 6.2831855) {
        this->phase_ = (fVar6 * 0.15915494 - (float)(int)(fVar6 * 0.15915494)) * 6.2831855;
      }
      uVar4 = uVar4 + 4;
      fi = fi + 4;
      fo = fo + 4;
    } while (uVar4 < nsamples);
  }
  return;
}

Assistant:

void Costas::work(
    size_t nsamples,
    std::complex<float>* fi,
    std::complex<float>* fo) {
  for (size_t i = 0; i < nsamples; i += 4) {
    float phase[4] = {
      -(phase_ + 0 * freq_),
      -(phase_ + 1 * freq_),
      -(phase_ + 2 * freq_),
      -(phase_ + 3 * freq_),
    };

    // Compute sin/cos for phase offset
    std::complex<float> sincos[4];
    for (size_t j = 0; j < 4; j++) {
      sincos[j].real(cosf(phase[j]));
      sincos[j].imag(sinf(phase[j]));
    }

    // Complex multiplication
    for (size_t j = 0; j < 4; j++) {
      fo[i + j] = fi[i + j] * sincos[j];
    }

    // Phase detector is executed for all samples,
    // Clip resulting value to [-1.0f, 1.0f].
    // Total error is average of 4 errors.
    float terr = 0.0f;
    for (size_t j = 0; j < 4; j++) {
      float err = fo[i + j].real() * fo[i + j].imag();
      terr += (0.5f * (fabsf(err + 1.0f) - fabsf(err - 1.0f))) / 4.0f;
    }

    // Update frequency and phase
    freq_ += beta_ * terr;
    phase_ += alpha_ * terr + freq_;

    // Clamp frequency
    freq_ = (0.5f * (fabsf(freq_ + maxDeviation_) -
                     fabsf(freq_ - maxDeviation_)));

    // Wrap phase if needed
    if (phase_ > M_2PI || phase_ < -M_2PI) {
      float frac = phase_ * (1.0 / M_2PI);
      phase_ = (frac - (float)((int)frac)) * M_2PI;
    }
  }
}